

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O0

void P_LineOpening(FLineOpening *open,AActor *actor,line_t *linedef,DVector2 *pos,DVector2 *ref,
                  int flags)

{
  double dVar1;
  sector_t *this;
  sector_t *this_00;
  bool bVar2;
  FTextureID FVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  double local_88;
  sector_t *local_80;
  bool usefront;
  double dStack_68;
  double bf;
  double bc;
  double ff;
  double fc;
  sector_t *back;
  sector_t *front;
  int flags_local;
  DVector2 *ref_local;
  DVector2 *pos_local;
  line_t *linedef_local;
  AActor *actor_local;
  FLineOpening *open_local;
  
  if ((flags & 4U) == 0) {
    ff = 0.0;
    bc = 0.0;
    bf = 0.0;
    dStack_68 = 0.0;
    if (linedef->backsector == (sector_t *)0x0) {
      open->range = 0.0;
      return;
    }
    this = linedef->frontsector;
    this_00 = linedef->backsector;
    if (((flags & 0x10U) == 0) && ((linedef->flags & 0x80000000) != 0)) {
      bVar2 = sector_t::PortalBlocksMovement(linedef->frontsector,1);
      if (!bVar2) {
        ff = 3.4028234663852886e+38;
      }
      bVar2 = sector_t::PortalBlocksMovement(linedef->backsector,1);
      if (!bVar2) {
        bf = 3.4028234663852886e+38;
      }
      bVar2 = sector_t::PortalBlocksMovement(linedef->frontsector,0);
      if (!bVar2) {
        bc = -3.4028234663852886e+38;
      }
      bVar2 = sector_t::PortalBlocksMovement(linedef->backsector,0);
      if (!bVar2) {
        dStack_68 = -3.4028234663852886e+38;
      }
    }
    if ((ff == 0.0) && (!NAN(ff))) {
      ff = secplane_t::ZatPoint(&this->ceilingplane,pos);
    }
    if ((bf == 0.0) && (!NAN(bf))) {
      bf = secplane_t::ZatPoint(&this_00->ceilingplane,pos);
    }
    if ((bc == 0.0) && (!NAN(bc))) {
      bc = secplane_t::ZatPoint(&this->floorplane,pos);
    }
    if ((dStack_68 == 0.0) && (!NAN(dStack_68))) {
      dStack_68 = secplane_t::ZatPoint(&this_00->floorplane,pos);
    }
    local_80 = this_00;
    if (ff < bf) {
      local_80 = this;
    }
    open->topsec = local_80;
    FVar3 = sector_t::GetTexture(open->topsec,1);
    (open->ceilingpic).texnum = FVar3.texnum;
    if (bf <= ff) {
      local_88 = bf;
    }
    else {
      local_88 = ff;
    }
    open->top = local_88;
    if ((((bc == -1.1754943508222875e-38) && (!NAN(bc))) ||
        ((dStack_68 == -1.1754943508222875e-38 && (!NAN(dStack_68))))) ||
       ((ref == (DVector2 *)0x0 || (0.00390625 < ABS(bc - dStack_68))))) {
      bVar2 = dStack_68 < bc;
    }
    else {
      bVar2 = secplane_t::isSlope(&this->floorplane);
      if (bVar2) {
        bVar2 = secplane_t::isSlope(&this_00->floorplane);
        if (bVar2) {
          iVar4 = P_PointOnLineSide(ref,linedef);
          bVar2 = iVar4 == 0;
        }
        else {
          bVar2 = false;
        }
      }
      else {
        bVar2 = true;
      }
    }
    if (bVar2) {
      open->bottom = bc;
      open->bottomsec = this;
      FVar3 = sector_t::GetTexture(this,0);
      (open->floorpic).texnum = FVar3.texnum;
      iVar4 = sector_t::GetTerrain(this,0);
      open->floorterrain = iVar4;
      if ((dStack_68 != -1.1754943508222875e-38) || (NAN(dStack_68))) {
        open->lowfloor = dStack_68;
      }
      else if ((flags & 0x100U) == 0) {
        dVar6 = pos->X;
        dVar1 = pos->Y;
        dVar5 = sector_t::GetPortalPlaneZ(this_00,0);
        dVar6 = sector_t::NextLowestFloorAt
                          (this_00,dVar6,dVar1,dVar5 - 1.52587890625e-05,0,0.0,(sector_t **)0x0,
                           (F3DFloor **)0x0);
        open->lowfloor = dVar6;
      }
    }
    else {
      open->bottom = dStack_68;
      open->bottomsec = this_00;
      FVar3 = sector_t::GetTexture(this_00,0);
      (open->floorpic).texnum = FVar3.texnum;
      iVar4 = sector_t::GetTerrain(this_00,0);
      open->floorterrain = iVar4;
      if ((bc != -1.1754943508222875e-38) || (NAN(bc))) {
        open->lowfloor = bc;
      }
      else if ((flags & 0x100U) == 0) {
        dVar6 = pos->X;
        dVar1 = pos->Y;
        dVar5 = sector_t::GetPortalPlaneZ(this,0);
        dVar6 = sector_t::NextLowestFloorAt
                          (this,dVar6,dVar1,dVar5 - 1.52587890625e-05,0,0.0,(sector_t **)0x0,
                           (F3DFloor **)0x0);
        open->lowfloor = dVar6;
      }
    }
    secplane_t::operator=(&open->frontfloorplane,&this->floorplane);
    secplane_t::operator=(&open->backfloorplane,&this_00->floorplane);
  }
  else {
    open->topsec = (sector_t *)0x0;
    FTextureID::SetInvalid(&open->ceilingpic);
    open->top = 3.4028234663852886e+38;
    open->bottomsec = (sector_t *)0x0;
    FTextureID::SetInvalid(&open->floorpic);
    open->floorterrain = -1;
    open->bottom = -3.4028234663852886e+38;
    open->lowfloor = 3.4028234663852886e+38;
    secplane_t::SetAtHeight(&open->frontfloorplane,-3.4028234663852886e+38,0);
    secplane_t::SetAtHeight(&open->backfloorplane,-3.4028234663852886e+38,0);
  }
  if ((((actor == (AActor *)0x0) ||
       (P_LineOpening_XFloors(open,actor,linedef,pos->X,pos->Y,(flags & 8U) != 0),
       linedef->frontsector == (sector_t *)0x0)) || (linedef->backsector == (sector_t *)0x0)) ||
     ((linedef->flags & 0x200000) == 0)) {
    open->touchmidtex = false;
    open->abovemidtex = false;
  }
  else {
    bVar2 = P_LineOpening_3dMidtex(actor,linedef,open,(flags & 8U) != 0);
    open->touchmidtex = bVar2;
  }
  dVar6 = clamp<double>(open->top - open->bottom,-3.4028234663852886e+38,3.4028234663852886e+38);
  open->range = dVar6;
  return;
}

Assistant:

void P_LineOpening (FLineOpening &open, AActor *actor, const line_t *linedef, const DVector2 &pos, const DVector2 *ref, int flags)
{
	if (!(flags & FFCF_ONLY3DFLOORS))
	{
		sector_t *front, *back;
		double fc = 0, ff = 0, bc = 0, bf = 0;

		if (linedef->backsector == NULL)
		{
			// single sided line
			open.range = 0;
			return;
		}

		front = linedef->frontsector;
		back = linedef->backsector;

		if (!(flags & FFCF_NOPORTALS) && (linedef->flags & ML_PORTALCONNECT))
		{
			if (!linedef->frontsector->PortalBlocksMovement(sector_t::ceiling)) fc = LINEOPEN_MAX;
			if (!linedef->backsector->PortalBlocksMovement(sector_t::ceiling)) bc = LINEOPEN_MAX;
			if (!linedef->frontsector->PortalBlocksMovement(sector_t::floor)) ff = LINEOPEN_MIN;
			if (!linedef->backsector->PortalBlocksMovement(sector_t::floor)) bf = LINEOPEN_MIN;
		}

		if (fc == 0) fc = front->ceilingplane.ZatPoint(pos);
		if (bc == 0) bc = back->ceilingplane.ZatPoint(pos);
		if (ff == 0) ff = front->floorplane.ZatPoint(pos);
		if (bf == 0) bf = back->floorplane.ZatPoint(pos);


		/*Printf ("]]]]]] %d %d\n", ff, bf);*/

		open.topsec = fc < bc? front : back;
		open.ceilingpic = open.topsec->GetTexture(sector_t::ceiling);
		open.top = fc < bc ? fc : bc;

		bool usefront;

		// [RH] fudge a bit for actors that are moving across lines
		// bordering a slope/non-slope that meet on the floor. Note
		// that imprecisions in the plane equation mean there is a
		// good chance that even if a slope and non-slope look like
		// they line up, they won't be perfectly aligned.
		if (ff == -FLT_MIN || bf == -FLT_MIN || ref == NULL || fabs (ff-bf) > 1./256)
		{
			usefront = (ff > bf);
		}
		else
		{
			if (!front->floorplane.isSlope())
				usefront = true;
			else if (!back->floorplane.isSlope())
				usefront = false;
			else
				usefront = !P_PointOnLineSide (*ref, linedef);
		}

		if (usefront)
		{
			open.bottom = ff;
			open.bottomsec = front;
			open.floorpic = front->GetTexture(sector_t::floor);
			open.floorterrain = front->GetTerrain(sector_t::floor);
			if (bf != -FLT_MIN) open.lowfloor = bf;
			else if (!(flags & FFCF_NODROPOFF))
			{
				// We must check through the portal for the actual dropoff.
				// If there's no lines in the lower sections we'd never get a usable value otherwise.
				open.lowfloor = back->NextLowestFloorAt(pos.X, pos.Y, back->GetPortalPlaneZ(sector_t::floor) - EQUAL_EPSILON);
			}
		}
		else
		{
			open.bottom = bf;
			open.bottomsec = back;
			open.floorpic = back->GetTexture(sector_t::floor);
			open.floorterrain = back->GetTerrain(sector_t::floor);
			if (ff != -FLT_MIN) open.lowfloor = ff;
			else if (!(flags & FFCF_NODROPOFF))
			{
				// We must check through the portal for the actual dropoff.
				// If there's no lines in the lower sections we'd never get a usable value otherwise.
				open.lowfloor = front->NextLowestFloorAt(pos.X, pos.Y, front->GetPortalPlaneZ(sector_t::floor) - EQUAL_EPSILON);
			}
		}
		open.frontfloorplane = front->floorplane;
		open.backfloorplane = back->floorplane;
	}
	else
	{ // Dummy stuff to have some sort of opening for the 3D checks to modify
		open.topsec = NULL;
		open.ceilingpic.SetInvalid();
		open.top = LINEOPEN_MAX;
		open.bottomsec = NULL;
		open.floorpic.SetInvalid();
		open.floorterrain = -1;
		open.bottom = LINEOPEN_MIN;
		open.lowfloor = LINEOPEN_MAX;
		open.frontfloorplane.SetAtHeight(LINEOPEN_MIN, sector_t::floor);
		open.backfloorplane.SetAtHeight(LINEOPEN_MIN, sector_t::floor);
	}

	// Check 3D floors
	if (actor != NULL)
	{
		P_LineOpening_XFloors(open, actor, linedef, pos.X, pos.Y, !!(flags & FFCF_3DRESTRICT));
	}

	if (actor != NULL && linedef->frontsector != NULL && linedef->backsector != NULL && 
		linedef->flags & ML_3DMIDTEX)
	{
		open.touchmidtex = P_LineOpening_3dMidtex(actor, linedef, open, !!(flags & FFCF_3DRESTRICT));
	}
	else
	{
		open.abovemidtex = open.touchmidtex = false;
	}

	// avoid overflows in the opening.
	open.range = clamp(open.top - open.bottom, LINEOPEN_MIN, LINEOPEN_MAX);
}